

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanical.cpp
# Opt level: O3

void __thiscall
Mechanization::Mechanization(Mechanization *this,Euler pose,BLH prvBLH,ELLIPSOID type,Output prv)

{
  long lVar1;
  ELLIPSOID *pEVar2;
  Mechanization *pMVar3;
  byte bVar4;
  
  bVar4 = 0;
  ELLIPSOID::ELLIPSOID(&this->type);
  (this->prvPose).yaw = pose.yaw;
  (this->prvPose).roll = pose.roll;
  (this->prvPose).pitch = pose.pitch;
  (this->prvPosi).B = prvBLH.B;
  (this->prvPosi).L = prvBLH.L;
  (this->prvPosi).H = prvBLH.H;
  pEVar2 = &type;
  pMVar3 = this;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pMVar3->type).a = pEVar2->a;
    pEVar2 = (ELLIPSOID *)((long)pEVar2 + (ulong)bVar4 * -0x10 + 8);
    pMVar3 = (Mechanization *)((long)pMVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = -6.36;
  (this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = -0.04;
  (this->prvVel).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = 0.049;
  (this->nowOut).time = 0.0;
  (this->nowOut).gx = 0.0;
  (this->nowOut).gy = 0.0;
  (this->nowOut).gz = 0.0;
  (this->nowOut).ax = 0.0;
  (this->nowOut).ay = 0.0;
  (this->nowOut).az = 0.0;
  (this->prvOut).time = prv.time;
  (this->prvOut).gx = prv.gx;
  (this->prvOut).gy = prv.gy;
  (this->prvOut).gz = prv.gz;
  (this->prvOut).ax = prv.ax;
  (this->prvOut).ay = prv.ay;
  (this->prvOut).az = prv.az;
  return;
}

Assistant:

Mechanization::Mechanization(Euler pose, BLH prvBLH, ELLIPSOID type, Output prv) {
    this->prvPose = pose;
    this->prvPosi = prvBLH;
    this->type = type;
    this->prvVel = Vector3d(-6.360, -0.040, 0.049);
    // this->prvVel = Vector3d::Zero();
    this->prvOut = prv;
}